

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol_reader.cpp
# Opt level: O3

bool __thiscall
HawkTracer::parser::ProtocolReader::_read_struct
          (ProtocolReader *this,FieldType *value,EventKlassField *field,Event *event,
          Event *base_event)

{
  pointer pcVar1;
  KlassRegister *this_00;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  int iVar5;
  Event *pEVar6;
  byte bVar7;
  bool bVar8;
  bool is_error;
  bool local_119;
  FieldType *local_118;
  Event *local_110;
  string local_108;
  undefined1 local_e8 [24];
  undefined1 local_d0 [24];
  size_type sStack_b8;
  float local_b0;
  size_type local_a8;
  __pthread_internal_list _Stack_a0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_90;
  HT_TimestampNs local_88;
  Event local_80;
  
  pcVar1 = (field->_type_name)._M_dataplus._M_p;
  local_118 = value;
  local_110 = event;
  local_d0._0_8_ = (__pthread_internal_list *)(local_d0 + 0x10);
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_d0,pcVar1,pcVar1 + (field->_type_name)._M_string_length);
  iVar5 = std::__cxx11::string::compare((char *)local_d0);
  if (iVar5 == 0) {
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    pcVar1 = (field->_name)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_108,pcVar1,pcVar1 + (field->_name)._M_string_length);
    iVar5 = std::__cxx11::string::compare((char *)&local_108);
    bVar8 = iVar5 == 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p);
    }
  }
  else {
    bVar8 = false;
  }
  if ((__pthread_internal_list *)local_d0._0_8_ != (__pthread_internal_list *)(local_d0 + 0x10)) {
    operator_delete((void *)local_d0._0_8_);
  }
  if (bVar8) {
    bVar7 = 1;
    if (this->_flat_events == false) {
      if (base_event == (Event *)0x0) {
        __assert_fail("base_event != nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/amzn[P]hawktracer/parser/protocol_reader.cpp"
                      ,0xdc,
                      "bool HawkTracer::parser::ProtocolReader::_read_struct(FieldType &, const EventKlassField &, Event *, Event *)"
                     );
      }
      pEVar6 = (Event *)operator_new(0x50);
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_HawkTracer::parser::Event::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_HawkTracer::parser::Event::Value>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_HawkTracer::parser::Event::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_HawkTracer::parser::Event::Value>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    *)pEVar6,base_event,base_event);
      peVar2 = (base_event->_klass).
               super___shared_ptr<const_HawkTracer::parser::EventKlass,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      p_Var3 = (base_event->_klass).
               super___shared_ptr<const_HawkTracer::parser::EventKlass,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      (base_event->_klass).
      super___shared_ptr<const_HawkTracer::parser::EventKlass,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (pEVar6->_klass).
      super___shared_ptr<const_HawkTracer::parser::EventKlass,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           peVar2;
      (pEVar6->_klass).
      super___shared_ptr<const_HawkTracer::parser::EventKlass,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = p_Var3;
      (base_event->_klass).
      super___shared_ptr<const_HawkTracer::parser::EventKlass,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      pEVar6->_timestamp = base_event->_timestamp;
      local_118->f_EVENT = pEVar6;
    }
  }
  else {
    this_00 = this->_klass_register;
    pcVar1 = (field->_type_name)._M_dataplus._M_p;
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_108,pcVar1,pcVar1 + (field->_type_name)._M_string_length);
    KlassRegister::get_klass_id(this_00,&local_108);
    KlassRegister::get_klass((KlassRegister *)local_e8,(HT_EventKlassId)this_00);
    local_d0._0_8_ = &_Stack_a0;
    local_d0._8_8_ = (__pthread_internal_list *)0x1;
    local_d0._16_8_ = (_Hash_node_base *)0x0;
    sStack_b8 = 0;
    local_b0 = 1.0;
    local_a8 = 0;
    _Stack_a0.__prev = (__pthread_internal_list *)0x0;
    _Stack_a0.__next = (__pthread_internal_list *)local_e8._0_8_;
    _Stack_90._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_;
    local_e8._0_8_ = 0;
    local_e8._8_8_ = 0;
    local_88 = 0xffffffffffffffff;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p);
    }
    _read_event(this,&local_119,(Event *)local_d0,base_event);
    if (this->_flat_events == true) {
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_HawkTracer::parser::Event::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_HawkTracer::parser::Event::Value>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_HawkTracer::parser::Event::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_HawkTracer::parser::Event::Value>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    *)&local_80,local_d0,local_d0);
      local_80._klass.
      super___shared_ptr<const_HawkTracer::parser::EventKlass,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)_Stack_a0.__next;
      local_80._klass.
      super___shared_ptr<const_HawkTracer::parser::EventKlass,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = _Stack_90._M_pi;
      _Stack_a0.__next = (__pthread_internal_list *)0x0;
      _Stack_90._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_80._timestamp = local_88;
      Event::merge(local_110,&local_80);
      Event::~Event(&local_80);
    }
    else {
      pEVar6 = (Event *)operator_new(0x50);
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_HawkTracer::parser::Event::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_HawkTracer::parser::Event::Value>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_HawkTracer::parser::Event::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_HawkTracer::parser::Event::Value>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    *)pEVar6,local_d0,local_d0);
      _Var4._M_pi = _Stack_90._M_pi;
      _Stack_90._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (pEVar6->_klass).
      super___shared_ptr<const_HawkTracer::parser::EventKlass,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)_Stack_a0.__next;
      (pEVar6->_klass).
      super___shared_ptr<const_HawkTracer::parser::EventKlass,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = _Var4._M_pi;
      _Stack_a0.__next = (__pthread_internal_list *)0x0;
      pEVar6->_timestamp = local_88;
      local_118->f_EVENT = pEVar6;
    }
    bVar7 = local_119 ^ 1;
    Event::~Event((Event *)local_d0);
  }
  return (bool)bVar7;
}

Assistant:

bool ProtocolReader::_read_struct(FieldType& value, const EventKlassField& field, Event* event, Event* base_event)
{
    if (field.get_type_name() == "HT_Event" && field.get_name() == "base")
    {
        if (!_flat_events)
        {
            assert(base_event != nullptr);
            value.f_EVENT = new Event(std::move(*base_event));
        }
        return true;
    }
    else
    {
        bool is_error;
        Event sub_event(_klass_register->get_klass(_klass_register->get_klass_id(field.get_type_name())));
        _read_event(is_error, sub_event, base_event);
        if (_flat_events)
        {
            event->merge(std::move(sub_event));
        }
        else
        {
            value.f_EVENT = new Event(std::move(sub_event));
        }
        return !is_error;
    }
}